

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O1

uint16_t __thiscall
icu_63::Normalizer2Impl::previousFCD16(Normalizer2Impl *this,UChar *start,UChar **s)

{
  UChar UVar1;
  UChar UVar2;
  UChar *pUVar3;
  uint16_t uVar4;
  
  pUVar3 = *s;
  *s = pUVar3 + -1;
  UVar1 = pUVar3[-1];
  if ((ushort)UVar1 < (ushort)this->minDecompNoCP) {
    return 0;
  }
  if (((ushort)UVar1 & 0xfc00) == 0xdc00) {
    if ((start < pUVar3 + -1) && (UVar2 = pUVar3[-2], (UVar2 & 0xfc00U) == 0xd800)) {
      *s = pUVar3 + -2;
      uVar4 = getFCD16FromNormData
                        (this,(uint)(ushort)UVar1 + (uint)(ushort)UVar2 * 0x400 + -0x35fdc00);
      return uVar4;
    }
  }
  else {
    if (this->smallFCD[(ushort)UVar1 >> 8] == 0) {
      return 0;
    }
    if ((ushort)((ushort)(1 << ((byte)UVar1 >> 5)) & (ushort)this->smallFCD[(ushort)UVar1 >> 8]) ==
        0) {
      return 0;
    }
  }
  uVar4 = getFCD16FromNormData(this,(uint)(ushort)UVar1);
  return uVar4;
}

Assistant:

uint16_t previousFCD16(const UChar *start, const UChar *&s) const {
        UChar32 c=*--s;
        if(c<minDecompNoCP) {
            return 0;
        }
        if(!U16_IS_TRAIL(c)) {
            if(!singleLeadMightHaveNonZeroFCD16(c)) {
                return 0;
            }
        } else {
            UChar c2;
            if(start<s && U16_IS_LEAD(c2=*(s-1))) {
                c=U16_GET_SUPPLEMENTARY(c2, c);
                --s;
            }
        }
        return getFCD16FromNormData(c);
    }